

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MPSegment::CutByDag
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *dags,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words)

{
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *pvVar1;
  const_reference pvVar2;
  long lVar3;
  size_t sVar4;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_RCX;
  long in_RSI;
  WordRange wr_1;
  WordRange wr;
  DictUnit *p;
  size_t i;
  const_iterator in_stack_ffffffffffffff98;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *this_00;
  WordRange local_58;
  WordRange local_48;
  DictUnit *local_38;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *local_30;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *local_20;
  long local_10;
  
  local_30 = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  while (this_00 = local_30,
        pvVar1 = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::size(local_20),
        this_00 < pvVar1) {
    pvVar2 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                       (local_20,(size_type)local_30);
    local_38 = pvVar2->pInfo;
    if (local_38 == (DictUnit *)0x0) {
      WordRange::WordRange
                (&local_58,(const_iterator)(local_10 + (long)local_30 * 0x14),
                 (const_iterator)(local_10 + (long)local_30 * 0x14));
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                (this_00,(value_type *)in_stack_ffffffffffffff98);
      local_30 = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 ((long)&(local_30->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      in_stack_ffffffffffffff98 = (const_iterator)(local_10 + (long)local_30 * 0x14);
      lVar3 = local_10 + (long)local_30 * 0x14;
      sVar4 = limonp::LocalVector<unsigned_int>::size(&local_38->word);
      WordRange::WordRange
                (&local_48,in_stack_ffffffffffffff98,(const_iterator)(lVar3 + sVar4 * 0x14 + -0x14))
      ;
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                (this_00,(value_type *)in_stack_ffffffffffffff98);
      sVar4 = limonp::LocalVector<unsigned_int>::size(&local_38->word);
      local_30 = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 ((long)&(local_30->
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar4);
    }
  }
  return;
}

Assistant:

void CutByDag(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        const vector<Dag>& dags, 
        vector<WordRange>& words) const {
    size_t i = 0;
    while (i < dags.size()) {
      const DictUnit* p = dags[i].pInfo;
      if (p) {
        assert(p->word.size() >= 1);
        WordRange wr(begin + i, begin + i + p->word.size() - 1);
        words.push_back(wr);
        i += p->word.size();
      } else { //single chinese word
        WordRange wr(begin + i, begin + i);
        words.push_back(wr);
        i++;
      }
    }
  }